

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

void __thiscall Minisat::Solver::shareViaCallback<Minisat::Clause>(Solver *this,Clause *v,int lbd)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Lit LVar5;
  reference pvVar6;
  uchar *puVar7;
  int in_EDX;
  size_t *siglen;
  size_t *siglen_00;
  Clause *in_RSI;
  uchar *puVar8;
  long in_RDI;
  size_t in_R8;
  Lit lit_1;
  int i_1;
  Lit lit;
  int i;
  bool filled_buffer;
  int local_88;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  int local_58;
  uint local_30;
  uint local_1c;
  
  if ((in_EDX <= *(int *)(in_RDI + 0x4b8)) &&
     (iVar3 = Clause::size(in_RSI), iVar3 <= *(int *)(in_RDI + 0x704))) {
    bVar2 = false;
    if ((*(long *)(in_RDI + 0x568) != 0) &&
       (iVar3 = Clause::size(in_RSI), iVar3 <= *(int *)(in_RDI + 0x560))) {
      Clause::size(in_RSI);
      std::vector<int,_std::allocator<int>_>::resize
                (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      local_1c = 0;
      while( true ) {
        uVar4 = Clause::size(in_RSI);
        puVar7 = (uchar *)(ulong)uVar4;
        if ((int)uVar4 <= (int)local_1c) break;
        puVar8 = (uchar *)(ulong)local_1c;
        LVar5 = Clause::operator[](in_RSI,local_1c);
        uVar4 = sign((EVP_PKEY_CTX *)(ulong)(uint)LVar5.x,puVar8,siglen,puVar7,in_R8);
        if ((uVar4 & 1) == 0) {
          local_58 = var(LVar5);
          local_58 = local_58 + 1;
        }
        else {
          iVar3 = var(LVar5);
          local_58 = -(iVar3 + 1);
        }
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x548),
                            (long)(int)local_1c);
        *pvVar6 = local_58;
        local_1c = local_1c + 1;
      }
      in_stack_ffffffffffffff88 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x548);
      iVar3 = Clause::size(in_RSI);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (in_stack_ffffffffffffff88,(long)iVar3);
      *pvVar6 = 0;
      bVar2 = true;
      pcVar1 = *(code **)(in_RDI + 0x568);
      in_stack_ffffffffffffff90 = *(vector<int,_std::allocator<int>_> **)(in_RDI + 0x540);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x548),0);
      (*pcVar1)(in_stack_ffffffffffffff90,pvVar6);
    }
    if ((((*(byte *)(in_RDI + 0x700) & 1) != 0) && (*(long *)(in_RDI + 0x710) != 0)) &&
       ((iVar3 = Clause::size(in_RSI), iVar3 < 3 || (in_EDX <= *(int *)(in_RDI + 0x4b8))))) {
      Clause::size(in_RSI);
      std::vector<int,_std::allocator<int>_>::resize
                (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      if (!bVar2) {
        local_30 = 0;
        while( true ) {
          uVar4 = Clause::size(in_RSI);
          puVar7 = (uchar *)(ulong)uVar4;
          if ((int)uVar4 <= (int)local_30) break;
          puVar8 = (uchar *)(ulong)local_30;
          LVar5 = Clause::operator[](in_RSI,local_30);
          uVar4 = sign((EVP_PKEY_CTX *)(ulong)(uint)LVar5.x,puVar8,siglen_00,puVar7,in_R8);
          if ((uVar4 & 1) == 0) {
            local_88 = var(LVar5);
            local_88 = local_88 + 1;
          }
          else {
            iVar3 = var(LVar5);
            local_88 = -(iVar3 + 1);
          }
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x548),
                              (long)(int)local_30);
          *pvVar6 = local_88;
          local_30 = local_30 + 1;
        }
      }
      (**(code **)(in_RDI + 0x710))(in_RDI + 0x548,in_EDX,*(undefined8 *)(in_RDI + 0x720));
    }
  }
  return;
}

Assistant:

inline void Solver::shareViaCallback(const V &v, int lbd)
{
    if (lbd > core_lbd_cut) return;
    if (v.size() > share_clause_max_size) return;

    bool filled_buffer = false;

    if (learnCallback != 0 && v.size() <= learnCallbackLimit) {
        learnCallbackBuffer.resize(v.size() + 1);
        for (int i = 0; i < v.size(); i++) {
            Lit lit = v[i];
            learnCallbackBuffer[i] = sign(lit) ? -(var(lit) + 1) : (var(lit) + 1);
        }
        learnCallbackBuffer[v.size()] = 0;
        filled_buffer = true;
        learnCallback(learnCallbackState, &(learnCallbackBuffer[0]));
    }

    /* share only limited clauses in parallel solving! */
    if (share_parallel && learnedClsCallback != 0 && (v.size() < 3 || lbd <= core_lbd_cut)) {
        learnCallbackBuffer.resize(v.size());
        if (!filled_buffer) {
            for (int i = 0; i < v.size(); i++) {
                Lit lit = v[i];
                learnCallbackBuffer[i] = sign(lit) ? -(var(lit) + 1) : (var(lit) + 1);
            }
        }
        learnedClsCallback(learnCallbackBuffer, lbd, issuer);
    }
}